

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O0

void __thiscall crnlib::texture_conversion::convert_params::print(convert_params *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  pixel_format fmt;
  char *pcVar7;
  convert_params *this_local;
  
  console::debug("\nTexture conversion parameters:");
  uVar3 = mipmapped_texture::get_width(this->m_pInput_texture);
  uVar4 = mipmapped_texture::get_height(this->m_pInput_texture);
  uVar5 = mipmapped_texture::get_num_faces(this->m_pInput_texture);
  uVar6 = mipmapped_texture::get_num_levels(this->m_pInput_texture);
  fmt = mipmapped_texture::get_format(this->m_pInput_texture);
  pcVar7 = pixel_format_helpers::get_pixel_format_string(fmt);
  bVar1 = mipmapped_texture::is_x_flipped(this->m_pInput_texture);
  bVar2 = mipmapped_texture::is_y_flipped(this->m_pInput_texture);
  console::debug("   Resolution: %ux%u, Faces: %u, Levels: %u, Format: %s, X Flipped: %u, Y Flipped: %u"
                 ,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6,pcVar7,(uint)bVar1,(uint)bVar2
                );
  pcVar7 = get_texture_type_desc(this->m_texture_type);
  console::debug("      texture_type: %s",pcVar7);
  pcVar7 = dynamic_string::get_ptr(&this->m_dst_filename);
  console::debug("      dst_filename: %s",pcVar7);
  pcVar7 = texture_file_types::get_extension(this->m_dst_file_type);
  console::debug("     dst_file_type: %s",pcVar7);
  pcVar7 = pixel_format_helpers::get_pixel_format_string(this->m_dst_format);
  console::debug("        dst_format: %s",pcVar7);
  console::debug("             quick: %u",(ulong)(this->m_quick & 1));
  console::debug(" use_source_format: %u",(ulong)(this->m_always_use_source_pixel_format & 1));
  console::debug("            Y Flip: %u",(ulong)(this->m_y_flip & 1));
  console::debug("            Unflip: %u",(ulong)(this->m_unflip & 1));
  return;
}

Assistant:

void convert_params::print()
        {
            console::debug("\nTexture conversion parameters:");
            console::debug("   Resolution: %ux%u, Faces: %u, Levels: %u, Format: %s, X Flipped: %u, Y Flipped: %u",
                m_pInput_texture->get_width(),
                m_pInput_texture->get_height(),
                m_pInput_texture->get_num_faces(),
                m_pInput_texture->get_num_levels(),
                pixel_format_helpers::get_pixel_format_string(m_pInput_texture->get_format()),
                m_pInput_texture->is_x_flipped(),
                m_pInput_texture->is_y_flipped());

            console::debug("      texture_type: %s", get_texture_type_desc(m_texture_type));
            console::debug("      dst_filename: %s", m_dst_filename.get_ptr());
            console::debug("     dst_file_type: %s", texture_file_types::get_extension(m_dst_file_type));
            console::debug("        dst_format: %s", pixel_format_helpers::get_pixel_format_string(m_dst_format));
            console::debug("             quick: %u", m_quick);
            console::debug(" use_source_format: %u", m_always_use_source_pixel_format);
            console::debug("            Y Flip: %u", m_y_flip);
            console::debug("            Unflip: %u", m_unflip);
        }